

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O2

void __thiscall DataSourceDOS::~DataSourceDOS(DataSourceDOS *this)

{
  (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
       (_func_int **)&PTR_get_name_abi_cxx11__00151da0;
  std::_Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>::
  ~_Vector_base(&(this->entries).
                 super__Vector_base<DataSourceDOS::DataEntry,_std::allocator<DataSourceDOS::DataEntry>_>
               );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->spae).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  DataSourceLegacy::~DataSourceLegacy(&this->super_DataSourceLegacy);
  return;
}

Assistant:

DataSourceDOS::~DataSourceDOS() {
}